

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o2.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::SegmentO2::Global(MatrixXd *__return_storage_ptr__,SegmentO2 *this,MatrixXd *local)

{
  undefined1 auVar1 [16];
  RhsNested **pppMVar2;
  runtime_error *this_00;
  undefined8 *puVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  ActualDstType actualDst;
  bool bVar7;
  long lVar8;
  double dVar9;
  long lVar10;
  VectorXd local_vec;
  RowwiseReturnType tmp;
  stringstream ss;
  scalar_product_op<double,_double> local_2c9;
  Lhs local_2c8;
  long lStack_2c0;
  undefined1 local_2b8 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>
  local_2a0;
  undefined1 local_248 [32];
  variable_if_dynamic<long,__1> local_228;
  undefined1 local_210 [40];
  variable_if_dynamic<long,__1> local_1e8;
  MatrixTypeNested local_1d8;
  variable_if_dynamic<long,__1> vStack_1d0;
  undefined8 local_1c8;
  undefined1 local_1b8 [16];
  variable_if_dynamic<long,__1> local_1a8;
  scalar_constant_op<double> sStack_1a0;
  RhsNested local_198;
  MatrixTypeNested local_158;
  variable_if_dynamic<long,__1> local_148;
  
  local_2a0._0_8_ = (pointer)0x0;
  local_2b8._0_8_ = local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_210,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)&local_2a0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_1b8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_210,(Rhs *)local_2b8,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)&local_2a0);
  lVar5 = ((local_198.m_expression)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar5) {
    pdVar4 = ((local_198.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar6 = ((local_198.m_expression)->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    bVar7 = false;
    lVar8 = 0;
    do {
      if (0 < lVar6) {
        lVar10 = 0;
        do {
          if (pdVar4[lVar10] < sStack_1a0.m_other) goto LAB_002a3cb5;
          lVar10 = lVar10 + 1;
        } while (lVar6 != lVar10);
      }
      lVar8 = lVar8 + 1;
      pdVar4 = pdVar4 + lVar6;
      bVar7 = lVar5 <= lVar8;
    } while (lVar8 != lVar5);
LAB_002a3cb5:
    if (!bVar7) goto LAB_002a3f75;
  }
  local_248._0_8_ = &DAT_3ff0000000000000;
  local_2c8.m_expression = local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)&local_2a0,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_248);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                   *)local_210,&local_2c8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)&local_2a0,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_248);
  if (0 < (long)local_210._16_8_) {
    lVar5 = *(long *)local_210._0_8_;
    bVar7 = false;
    dVar9 = 0.0;
    do {
      if (0 < (long)local_210._8_8_) {
        lVar6 = 0;
        do {
          if ((double)local_210._24_8_ < *(double *)(lVar5 + lVar6 * 8)) goto LAB_002a3d69;
          lVar6 = lVar6 + 1;
        } while (local_210._8_8_ != lVar6);
      }
      dVar9 = (double)((long)dVar9 + 1);
      lVar5 = lVar5 + *(Index *)(local_210._0_8_ + 8) * 8;
      bVar7 = (long)local_210._16_8_ <= (long)dVar9;
    } while (dVar9 != (double)local_210._16_8_);
LAB_002a3d69:
    if (!bVar7) {
LAB_002a3f75:
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"local coordinates out of bounds for reference element",0x35)
      ;
      local_210._0_8_ = (NestedExpressionType)(local_210 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"(0. <= local.array()).all() && (local.array() <= 1.).all()",""
                );
      pppMVar2 = (RhsNested **)&local_2a0.m_lhs.m_expression.m_lhs.m_rhs;
      local_2a0._0_8_ = pppMVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_210,(string *)&local_2a0,0x1e,(string *)local_248);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
      }
      if ((RhsNested **)local_2a0._0_8_ != pppMVar2) {
        operator_delete((void *)local_2a0._0_8_,(long)local_2a0.m_lhs.m_expression.m_lhs.m_rhs + 1);
      }
      if ((NestedExpressionType)local_210._0_8_ != (NestedExpressionType)(local_210 + 0x10)) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_2c8.m_expression = (NestedExpressionType)0x0;
  lStack_2c0 = 0;
  local_1b8._0_8_ = local;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  resizeLike<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2c8,
             (EigenBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_1b8);
  pdVar4 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1b8._0_8_)->
           m_storage).m_data;
  lVar5 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1b8._0_8_)->
          m_storage).m_rows;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
            ((non_const_type)&local_2c8,
             (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1b8,
             (assign_op<double,_double> *)local_210);
  if (0 < lStack_2c0) {
    lVar6 = 0;
    do {
      (&((local_2c8.m_expression)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
        .m_storage.m_data)[lVar6] = (double *)*pdVar4;
      lVar6 = lVar6 + 1;
      pdVar4 = pdVar4 + lVar5;
    } while (lStack_2c0 != lVar6);
  }
  Eigen::
  Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)local_210,&this->alpha_,local);
  local_2a0._0_8_ = local_210._0_8_;
  local_2a0.m_lhs.m_expression.m_lhs.m_lhs = (LhsNested)local_210._8_8_;
  local_210._0_8_ = &this->beta_;
  local_210._16_8_ = *(undefined8 *)(local_210._8_8_ + 0x10);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
                   *)local_1b8,(Lhs *)&local_2a0,(Rhs *)local_210,
                  (scalar_sum_op<double,_double> *)local_2b8);
  local_248._16_8_ = local_1a8.m_value;
  local_248._24_8_ = sStack_1a0.m_other;
  local_248._0_8_ = local_1b8._0_8_;
  local_248._8_8_ = local_1b8._8_8_;
  local_228.m_value = (long)local_198.m_expression;
  local_2b8._8_8_ = *(long *)(local_1a8.m_value + 8);
  local_2b8._0_8_ = (non_const_type)&local_2c8;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_-1>_>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1>_>
  ::CwiseBinaryOp(&local_2a0,(Lhs *)local_248,(Rhs *)local_2b8,&local_2c9);
  local_210._8_8_ = local_2a0.m_lhs.m_expression.m_lhs.m_lhs;
  local_210._16_8_ = local_2a0.m_lhs.m_expression.m_lhs.m_rhs;
  local_210._24_8_ = local_2a0.m_lhs.m_expression.m_rhs.m_matrix;
  local_210._32_8_ = local_2a0.m_lhs.m_expression.m_rhs._8_8_;
  local_1e8.m_value = local_2a0.m_lhs.m_expression.m_rhs.m_colFactor.m_value;
  local_1d8.m_expression.m_matrix = local_2a0.m_rhs.m_matrix.m_expression.m_matrix;
  vStack_1d0.m_value = local_2a0.m_rhs.m_rowFactor.m_value;
  local_1c8 = local_2a0.m_rhs._16_8_;
  local_2b8._0_8_ = &this->gamma_;
  local_2b8._16_8_ = *(Index *)((long)local_2a0.m_rhs.m_matrix.m_expression.m_matrix + 8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_-1>_>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1>_>_>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
                   *)local_1b8,(Lhs *)local_210,(Rhs *)local_2b8,
                  (scalar_sum_op<double,_double> *)&local_2c9);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  lVar5 = (local_158->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if ((local_148.m_value != 0 && lVar5 != 0) &&
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar1 / SEXT816(local_148.m_value),0) < lVar5)) {
    puVar3 = (undefined8 *)
             __cxa_allocate_exception(8,lVar5,SUB168(auVar1 % SEXT816(local_148.m_value),0));
    *puVar3 = &std::out_of_range::vtable;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,lVar5,
             local_148.m_value);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Replicate<Eigen::Matrix<double,_1,1,0,_1,1>,1,_1>const>>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>,_1,1>const>>const,Eigen::Replicate<Eigen::Matrix<double,_1,1,0,_1,1>,1,_1>const>,Eigen::internal::assign_op<double,double>>
            (__return_storage_ptr__,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
              *)local_1b8,(assign_op<double,_double> *)local_2b8);
  free(local_2c8.m_expression);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd SegmentO2::Global(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  // evaluate polynomial with Horner scheme
  Eigen::VectorXd local_vec = local.transpose();
  auto tmp = ((alpha_ * local).colwise() + beta_).array().rowwise();

  return (tmp * local_vec.transpose().array()).matrix().colwise() + gamma_;
}